

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

JavascriptRegExp *
Js::JavascriptRegExp::CreateRegEx(Var aValue,Var options,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptRegExp *pJVar2;
  RegexPattern *pattern;
  
  bVar1 = VarIs<Js::JavascriptRegExp>(aValue);
  if (bVar1) {
    pJVar2 = VarTo<Js::JavascriptRegExp>(aValue);
    return pJVar2;
  }
  pattern = CreatePattern(aValue,options,scriptContext);
  pJVar2 = JavascriptLibrary::CreateRegExp
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,pattern);
  return pJVar2;
}

Assistant:

JavascriptRegExp* JavascriptRegExp::CreateRegEx(Var aValue, Var options, ScriptContext *scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_CoerseRegex);
        // This is called as helper from OpCode::CoerseRegEx. If aValue is regex pattern /a/, CreatePattern converts
        // it to pattern "/a/" instead of "a". So if we know that aValue is regex, then just return the same object
        if (VarIs<JavascriptRegExp>(aValue))
        {
            return VarTo<JavascriptRegExp>(aValue);
        }
        else
        {
            return CreateRegExNoCoerce(aValue, options, scriptContext);
        }
        JIT_HELPER_END(Op_CoerseRegex);
    }